

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t environment_)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t astNode__00;
  undefined1 local_68 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_e8ce2cef gcFrame;
  sysbvm_tuple_t environment__local;
  sysbvm_tuple_t astNode__local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)astNode_;
  memset(local_68,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context,environment_);
  astNode__00 = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment
                          (context,(sysbvm_tuple_t)gcFrameRecord.roots,environment_);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
  sVar1 = sysbvm_interpreter_applyCoercionToASTNodeIntoType(context,astNode__00,environment_,sVar1);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t environment_)
{
    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t environment;
        sysbvm_tuple_t targetType;
        sysbvm_tuple_t result;

        sysbvm_tuple_t coercionExpressionType;
    } gcFrame = {
        .astNode = astNode_,
        .environment = environment_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.targetType = sysbvm_analysisAndEvaluationEnvironment_getExpectedType(context, gcFrame.environment);
    gcFrame.result = sysbvm_interpreter_analyzeASTIfNeededWithEnvironment(context, gcFrame.astNode, gcFrame.environment);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_interpreter_applyCoercionToASTNodeIntoType(context, gcFrame.result, gcFrame.environment, gcFrame.targetType);
}